

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool __thiscall bssl::ssl_is_valid_ech_public_name(bssl *this,Span<const_unsigned_char> public_name)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  iterator puVar4;
  iterator __last;
  uchar *puVar5;
  size_t sVar6;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  Span<const_unsigned_char> in;
  Span<const_unsigned_char> SVar7;
  byte local_f1;
  uint8_t c;
  iterator __end2;
  iterator __begin2;
  Span<const_unsigned_char> *__range2;
  uchar *local_88;
  uchar *local_80;
  uchar *local_78;
  Span<const_unsigned_char> local_70;
  undefined1 local_60 [8];
  Span<const_unsigned_char> component;
  uchar *dot;
  Span<const_unsigned_char> last;
  Span<const_unsigned_char> remaining;
  Span<const_unsigned_char> public_name_local;
  
  remaining.data_ = public_name.data_;
  last.size_ = (size_t)this;
  bVar2 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&last.size_);
  if (bVar2) {
    public_name_local.size_._7_1_ = false;
  }
  else {
    Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)&dot);
    while (bVar2 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&last.size_),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      puVar4 = Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)&last.size_);
      __last = Span<const_unsigned_char>::end((Span<const_unsigned_char> *)&last.size_);
      component.size_._7_1_ = 0x2e;
      puVar5 = std::find<unsigned_char_const*,char>
                         (puVar4,__last,(char *)((long)&component.size_ + 7));
      Span<const_unsigned_char>::Span((Span<const_unsigned_char> *)local_60);
      puVar4 = Span<const_unsigned_char>::end((Span<const_unsigned_char> *)&last.size_);
      if (puVar5 == puVar4) {
        local_60 = (undefined1  [8])last.size_;
        component.data_ = remaining.data_;
        dot = (uchar *)last.size_;
        last.data_ = remaining.data_;
        Span<const_unsigned_char>::Span(&local_70);
        last.size_ = (size_t)local_70.data_;
        remaining.data_ = (uchar *)local_70.size_;
      }
      else {
        puVar4 = Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)&last.size_);
        SVar7 = Span<const_unsigned_char>::subspan
                          ((Span<const_unsigned_char> *)&last.size_,0,(long)puVar5 - (long)puVar4);
        local_80 = SVar7.data_;
        local_60 = (undefined1  [8])local_80;
        local_78 = (uchar *)SVar7.size_;
        component.data_ = local_78;
        puVar4 = Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)&last.size_);
        SVar7 = Span<const_unsigned_char>::subspan
                          ((Span<const_unsigned_char> *)&last.size_,
                           (size_t)(puVar5 + (1 - (long)puVar4)),0xffffffffffffffff);
        __range2 = (Span<const_unsigned_char> *)SVar7.data_;
        last.size_ = (size_t)__range2;
        local_88 = (uchar *)SVar7.size_;
        remaining.data_ = local_88;
        bVar2 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)&last.size_);
        if (bVar2) {
          return false;
        }
      }
      bVar2 = Span<const_unsigned_char>::empty((Span<const_unsigned_char> *)local_60);
      if ((((bVar2) ||
           (sVar6 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)local_60),
           0x3f < sVar6)) ||
          (puVar5 = Span<const_unsigned_char>::front((Span<const_unsigned_char> *)local_60),
          *puVar5 == '-')) ||
         (puVar5 = Span<const_unsigned_char>::back((Span<const_unsigned_char> *)local_60),
         *puVar5 == '-')) {
        return false;
      }
      __end2 = Span<const_unsigned_char>::begin((Span<const_unsigned_char> *)local_60);
      puVar4 = Span<const_unsigned_char>::end((Span<const_unsigned_char> *)local_60);
      for (; __end2 != puVar4; __end2 = __end2 + 1) {
        bVar1 = *__end2;
        iVar3 = OPENSSL_isalnum((uint)bVar1);
        if ((iVar3 == 0) && (bVar1 != 0x2d)) {
          return false;
        }
      }
    }
    SVar7.size_ = extraout_RDX;
    SVar7.data_ = last.data_;
    bVar2 = is_hex_component((bssl *)dot,SVar7);
    local_f1 = 0;
    if (!bVar2) {
      in.size_ = extraout_RDX_00;
      in.data_ = last.data_;
      bVar2 = is_decimal_component((bssl *)dot,in);
      local_f1 = bVar2 ^ 0xff;
    }
    public_name_local.size_._7_1_ = (bool)(local_f1 & 1);
  }
  return public_name_local.size_._7_1_;
}

Assistant:

bool ssl_is_valid_ech_public_name(Span<const uint8_t> public_name) {
  // See draft-ietf-tls-esni-13, Section 4 and RFC 5890, Section 2.3.1. The
  // public name must be a dot-separated sequence of LDH labels and not begin or
  // end with a dot.
  auto remaining = public_name;
  if (remaining.empty()) {
    return false;
  }
  Span<const uint8_t> last;
  while (!remaining.empty()) {
    // Find the next dot-separated component.
    auto dot = std::find(remaining.begin(), remaining.end(), '.');
    Span<const uint8_t> component;
    if (dot == remaining.end()) {
      component = remaining;
      last = component;
      remaining = Span<const uint8_t>();
    } else {
      component = remaining.subspan(0, dot - remaining.begin());
      // Skip the dot.
      remaining = remaining.subspan(dot - remaining.begin() + 1);
      if (remaining.empty()) {
        // Trailing dots are not allowed.
        return false;
      }
    }
    // |component| must be a valid LDH label. Checking for empty components also
    // rejects leading dots.
    if (component.empty() || component.size() > 63 ||
        component.front() == '-' || component.back() == '-') {
      return false;
    }
    for (uint8_t c : component) {
      if (!OPENSSL_isalnum(c) && c != '-') {
        return false;
      }
    }
  }

  // The WHATWG URL parser additionally does not allow any DNS names that end in
  // a numeric component. See:
  // https://url.spec.whatwg.org/#concept-host-parser
  // https://url.spec.whatwg.org/#ends-in-a-number-checker
  //
  // The WHATWG parser is formulated in terms of parsing decimal, octal, and
  // hex, along with a separate ASCII digits check. The ASCII digits check
  // subsumes the decimal and octal check, so we only need to check two cases.
  return !is_hex_component(last) && !is_decimal_component(last);
}